

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O0

void __thiscall deqp::gls::BeforeDrawValidator::beforeDrawCall(BeforeDrawValidator *this)

{
  GLuint GVar1;
  glGetProgramInfoLogFunc p_Var2;
  glGetProgramPipelineInfoLogFunc p_Var3;
  GLenum GVar4;
  deBool dVar5;
  int iVar6;
  TestError *this_00;
  reference pvVar7;
  difference_type dVar8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_78;
  char local_69;
  char *local_68;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_60;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_58;
  value_type local_49 [21];
  undefined4 local_34;
  undefined1 local_30 [4];
  int stringLength;
  vector<char,_std::allocator<char>_> logBuffer;
  GLint infoLogLength;
  GLint bytesWritten;
  BeforeDrawValidator *this_local;
  
  logBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_30);
  if (this->m_targetType == TARGETTYPE_PROGRAM) {
    (*this->m_gl->validateProgram)(this->m_target);
  }
  else if (this->m_targetType == TARGETTYPE_PIPELINE) {
    (*this->m_gl->validateProgramPipeline)(this->m_target);
  }
  GVar4 = (*this->m_gl->getError)();
  glu::checkError(GVar4,"validate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderLibraryCase.cpp"
                  ,0x28f);
  this->m_validateStatus = -1;
  if (this->m_targetType == TARGETTYPE_PROGRAM) {
    (*this->m_gl->getProgramiv)(this->m_target,0x8b83,&this->m_validateStatus);
  }
  else if (this->m_targetType == TARGETTYPE_PIPELINE) {
    (*this->m_gl->getProgramPipelineiv)(this->m_target,0x8b83,&this->m_validateStatus);
  }
  GVar4 = (*this->m_gl->getError)();
  glu::checkError(GVar4,"get validate status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderLibraryCase.cpp"
                  ,0x29b);
  while ((dVar5 = ::deGetFalse(), dVar5 == 0 &&
         ((this->m_validateStatus == 1 || (this->m_validateStatus == 0))))) {
    dVar5 = ::deGetFalse();
    if (dVar5 == 0) {
      logBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 0;
      if (this->m_targetType == TARGETTYPE_PROGRAM) {
        (*this->m_gl->getProgramiv)
                  (this->m_target,0x8b84,
                   (GLint *)&logBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             field_0x10);
      }
      else if (this->m_targetType == TARGETTYPE_PIPELINE) {
        (*this->m_gl->getProgramPipelineiv)
                  (this->m_target,0x8b84,
                   (GLint *)&logBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             field_0x10);
      }
      GVar4 = (*this->m_gl->getError)();
      glu::checkError(GVar4,"get info log length",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderLibraryCase.cpp"
                      ,0x2a9);
      if ((int)logBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ < 1) {
        std::__cxx11::string::clear();
        local_49[1] = '\x01';
        local_49[2] = '\0';
        local_49[3] = '\0';
        local_49[4] = '\0';
      }
      else {
        local_49[0] = '0';
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)local_30,
                   (long)(logBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ +
                         2),local_49);
        if (this->m_targetType == TARGETTYPE_PROGRAM) {
          p_Var2 = this->m_gl->getProgramInfoLog;
          GVar1 = this->m_target;
          iVar6 = logBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ + 1;
          pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)local_30,0);
          (*p_Var2)(GVar1,iVar6,
                    (GLsizei *)
                    &logBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14,
                    pvVar7);
        }
        else if (this->m_targetType == TARGETTYPE_PIPELINE) {
          p_Var3 = this->m_gl->getProgramPipelineInfoLog;
          GVar1 = this->m_target;
          iVar6 = logBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ + 1;
          pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)local_30,0);
          (*p_Var3)(GVar1,iVar6,
                    (GLsizei *)
                    &logBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14,
                    pvVar7);
        }
        local_60._M_current =
             (char *)std::vector<char,_std::allocator<char>_>::begin
                               ((vector<char,_std::allocator<char>_> *)local_30);
        local_68 = (char *)std::vector<char,_std::allocator<char>_>::end
                                     ((vector<char,_std::allocator<char>_> *)local_30);
        local_69 = '0';
        local_58 = std::
                   find<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,char>
                             (local_60,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                        )local_68,&local_69);
        local_78._M_current =
             (char *)std::vector<char,_std::allocator<char>_>::begin
                               ((vector<char,_std::allocator<char>_> *)local_30);
        dVar8 = __gnu_cxx::operator-(&local_58,&local_78);
        local_34 = (undefined4)dVar8;
        pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)local_30,0);
        std::__cxx11::string::assign((char *)&this->m_logMessage,(ulong)pvVar7);
        local_49[1] = '\0';
        local_49[2] = '\0';
        local_49[3] = '\0';
        local_49[4] = '\0';
      }
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_30);
      return;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"m_validateStatus == GL_TRUE || m_validateStatus == GL_FALSE",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderLibraryCase.cpp"
             ,0x29c);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void BeforeDrawValidator::beforeDrawCall (void)
{
	glw::GLint					bytesWritten	= 0;
	glw::GLint					infoLogLength;
	std::vector<glw::GLchar>	logBuffer;
	int							stringLength;

	// validate
	if (m_targetType == TARGETTYPE_PROGRAM)
		m_gl.validateProgram(m_target);
	else if (m_targetType == TARGETTYPE_PIPELINE)
		m_gl.validateProgramPipeline(m_target);
	else
		DE_ASSERT(false);

	GLU_EXPECT_NO_ERROR(m_gl.getError(), "validate");

	// check status
	m_validateStatus = -1;

	if (m_targetType == TARGETTYPE_PROGRAM)
		m_gl.getProgramiv(m_target, GL_VALIDATE_STATUS, &m_validateStatus);
	else if (m_targetType == TARGETTYPE_PIPELINE)
		m_gl.getProgramPipelineiv(m_target, GL_VALIDATE_STATUS, &m_validateStatus);
	else
		DE_ASSERT(false);

	GLU_EXPECT_NO_ERROR(m_gl.getError(), "get validate status");
	TCU_CHECK(m_validateStatus == GL_TRUE || m_validateStatus == GL_FALSE);

	// read log

	infoLogLength = 0;

	if (m_targetType == TARGETTYPE_PROGRAM)
		m_gl.getProgramiv(m_target, GL_INFO_LOG_LENGTH, &infoLogLength);
	else if (m_targetType == TARGETTYPE_PIPELINE)
		m_gl.getProgramPipelineiv(m_target, GL_INFO_LOG_LENGTH, &infoLogLength);
	else
		DE_ASSERT(false);

	GLU_EXPECT_NO_ERROR(m_gl.getError(), "get info log length");

	if (infoLogLength <= 0)
	{
		m_logMessage.clear();
		return;
	}

	logBuffer.resize(infoLogLength + 2, '0'); // +1 for zero terminator (infoLogLength should include it, but better play it safe), +1 to make sure buffer is always larger

	if (m_targetType == TARGETTYPE_PROGRAM)
		m_gl.getProgramInfoLog(m_target, infoLogLength + 1, &bytesWritten, &logBuffer[0]);
	else if (m_targetType == TARGETTYPE_PIPELINE)
		m_gl.getProgramPipelineInfoLog(m_target, infoLogLength + 1, &bytesWritten, &logBuffer[0]);
	else
		DE_ASSERT(false);

	// just ignore bytesWritten to be safe, find the null terminator
	stringLength = (int)(std::find(logBuffer.begin(), logBuffer.end(), '0') - logBuffer.begin());
	m_logMessage.assign(&logBuffer[0], stringLength);
}